

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

string * get_temp_folder_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"/tmp/","");
  return in_RDI;
}

Assistant:

string get_temp_folder() {
#if defined(_MSC_VER) || defined(MS_WINDOWS) ||  defined(WIN32)
    string buffer;
    buffer.resize(1000);
    const auto new_size = GetTempPathA(buffer.size(), &buffer[0]); //deal with newsize == 0
    buffer.resize(new_size);
    return buffer;
#else
    return "/tmp/";
#endif
}